

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O0

UChar32 ucnv_extSimpleMatchToU_63(int32_t *cx,char *source,int32_t length,UBool useFallback)

{
  uint32_t uVar1;
  uint32_t local_2c;
  int32_t match;
  uint32_t value;
  UBool useFallback_local;
  char *pcStack_20;
  int32_t length_local;
  char *source_local;
  int32_t *cx_local;
  
  local_2c = 0;
  if (length < 1) {
    cx_local._4_4_ = 0xffff;
  }
  else {
    match._3_1_ = useFallback;
    value = length;
    pcStack_20 = source;
    source_local = (char *)cx;
    uVar1 = ucnv_extMatchToU(cx,-1,source,length,(char *)0x0,0,&local_2c,useFallback,'\x01');
    if ((uVar1 == value) && (local_2c < 0x300000)) {
      cx_local._4_4_ = local_2c - 0x1f0000;
    }
    else {
      cx_local._4_4_ = 0xfffe;
    }
  }
  return cx_local._4_4_;
}

Assistant:

U_CFUNC UChar32
ucnv_extSimpleMatchToU(const int32_t *cx,
                       const char *source, int32_t length,
                       UBool useFallback) {
    uint32_t value = 0;  /* initialize output-only param to 0 to silence gcc */
    int32_t match;

    if(length<=0) {
        return 0xffff;
    }

    /* try to match */
    match=ucnv_extMatchToU(cx, -1,
                           source, length,
                           NULL, 0,
                           &value,
                           useFallback, TRUE);
    if(match==length) {
        /* write result for simple, single-character conversion */
        if(UCNV_EXT_TO_U_IS_CODE_POINT(value)) {
            return UCNV_EXT_TO_U_GET_CODE_POINT(value);
        }
    }

    /*
     * return no match because
     * - match>0 && value points to string: simple conversion cannot handle multiple code points
     * - match>0 && match!=length: not all input consumed, forbidden for this function
     * - match==0: no match found in the first place
     * - match<0: partial match, not supported for simple conversion (and flush==TRUE)
     */
    return 0xfffe;
}